

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::decodeHDREndpointMode11
               (UVec4 *e0,UVec4 *e1,deUint32 v0,deUint32 v1,deUint32 v2,deUint32 v3,deUint32 v4,
               deUint32 v5)

{
  deUint32 dVar1;
  deUint32 dVar2;
  uint uVar3;
  uint uVar4;
  deUint32 dVar5;
  deInt32 dVar6;
  uint uVar7;
  uint *puVar8;
  uint *puVar9;
  byte bVar10;
  Vector<unsigned_int,_4> local_a4;
  Vector<unsigned_int,_4> local_94;
  uint local_84;
  deUint32 local_80;
  int shiftAmount;
  deUint32 x5;
  deUint32 x4;
  deUint32 x3;
  deUint32 x2;
  deUint32 x1;
  deUint32 x0;
  deInt32 d1;
  deInt32 d0;
  deInt32 b1;
  deInt32 b0;
  deInt32 c;
  deInt32 a;
  deUint32 mode;
  uint local_44 [2];
  Vector<unsigned_int,_4> local_3c;
  uint local_2c;
  deUint32 local_28;
  deUint32 major;
  deUint32 v3_local;
  deUint32 v2_local;
  deUint32 v1_local;
  deUint32 v0_local;
  UVec4 *e1_local;
  UVec4 *e0_local;
  
  local_28 = v3;
  major = v2;
  v3_local = v1;
  v2_local = v0;
  _v1_local = e1;
  e1_local = e0;
  dVar1 = getBit(v5,7);
  dVar2 = getBit(v4,7);
  local_2c = dVar1 << 1 | dVar2;
  if (local_2c == 3) {
    uVar3 = v2_local << 4;
    uVar4 = major << 4;
    dVar1 = getBits(v4,0,6);
    Vector<unsigned_int,_4>::Vector(&local_3c,uVar3,uVar4,dVar1 << 5,0x780);
    *(undefined8 *)e1_local->m_data = local_3c.m_data._0_8_;
    *(undefined8 *)(e1_local->m_data + 2) = local_3c.m_data._8_8_;
    uVar3 = v3_local << 4;
    uVar4 = local_28 << 4;
    dVar1 = getBits(v5,0,6);
    Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&a,uVar3,uVar4,dVar1 << 5,0x780);
    *(undefined8 *)_v1_local->m_data = _a;
    *(uint (*) [2])(_v1_local->m_data + 2) = local_44;
  }
  else {
    dVar1 = getBit(local_28,7);
    dVar2 = getBit(major,7);
    dVar5 = getBit(v3_local,7);
    c = dVar1 << 2 | dVar2 * 2 | dVar5;
    dVar1 = getBit(v3_local,6);
    b0 = dVar1 << 8 | v2_local;
    b1 = getBits(v3_local,0,5);
    d0 = getBits(major,0,5);
    d1 = getBits(local_28,0,5);
    x0 = getBits(v4,0,4);
    x1 = getBits(v5,0,4);
    x2 = getBit(major,6);
    x3 = getBit(local_28,6);
    x4 = getBit(v4,6);
    x5 = getBit(v5,6);
    shiftAmount = getBit(v4,5);
    local_80 = getBit(v5,5);
    switch(c) {
    case 0:
      d0 = x2 << 6 | d0;
      d1 = x3 << 6 | d1;
      x0 = shiftAmount << 5 | x4 << 6 | x0;
      x1 = local_80 << 5 | x5 << 6 | x1;
      break;
    case 1:
      d0 = x4 << 7 | x2 << 6 | d0;
      d1 = x5 << 7 | x3 << 6 | d1;
      x0 = shiftAmount << 5 | x0;
      x1 = local_80 << 5 | x1;
      break;
    case 2:
      b0 = x2 << 9 | b0;
      b1 = x3 << 6 | b1;
      x0 = shiftAmount << 5 | x4 << 6 | x0;
      x1 = local_80 << 5 | x5 << 6 | x1;
      break;
    case 3:
      d0 = x2 << 6 | d0;
      d1 = x3 << 6 | d1;
      b0 = x4 << 9 | b0;
      b1 = x5 << 6 | b1;
      x0 = shiftAmount << 5 | x0;
      x1 = local_80 << 5 | x1;
      break;
    case 4:
      d0 = x4 << 7 | x2 << 6 | d0;
      d1 = x5 << 7 | x3 << 6 | d1;
      b0 = local_80 << 10 | shiftAmount << 9 | b0;
      break;
    case 5:
      b0 = x3 << 10 | x2 << 9 | b0;
      b1 = x5 << 6 | x4 << 7 | b1;
      x0 = shiftAmount << 5 | x0;
      x1 = local_80 << 5 | x1;
      break;
    case 6:
      d0 = x2 << 6 | d0;
      d1 = x3 << 6 | d1;
      b1 = x5 << 6 | b1;
      b0 = local_80 << 10 | shiftAmount << 9 | x4 << 0xb | b0;
      break;
    case 7:
      b0 = x4 << 0xb | x3 << 10 | x2 << 9 | b0;
      b1 = x5 << 6 | b1;
      x0 = shiftAmount << 5 | x0;
      x1 = local_80 << 5 | x1;
    }
    x0 = signExtend(x0,decodeHDREndpointMode11::numDBits[(uint)c]);
    dVar6 = signExtend(x1,decodeHDREndpointMode11::numDBits[(uint)c]);
    local_84 = (uint)c >> 1 ^ 3;
    bVar10 = (byte)local_84;
    b0 = b0 << (bVar10 & 0x1f);
    b1 = b1 << (bVar10 & 0x1f);
    d0 = d0 << (bVar10 & 0x1f);
    d1 = d1 << (bVar10 & 0x1f);
    x0 = x0 << (bVar10 & 0x1f);
    x1 = dVar6 << (bVar10 & 0x1f);
    uVar3 = de::clamp<int>(b0 - b1,0,0xfff);
    uVar4 = de::clamp<int>(((b0 - d0) - b1) - x0,0,0xfff);
    uVar7 = de::clamp<int>(((b0 - d1) - b1) - x1,0,0xfff);
    Vector<unsigned_int,_4>::Vector(&local_94,uVar3,uVar4,uVar7,0x780);
    *(undefined8 *)e1_local->m_data = local_94.m_data._0_8_;
    *(undefined8 *)(e1_local->m_data + 2) = local_94.m_data._8_8_;
    uVar3 = de::clamp<int>(b0,0,0xfff);
    uVar4 = de::clamp<int>(b0 - d0,0,0xfff);
    uVar7 = de::clamp<int>(b0 - d1,0,0xfff);
    Vector<unsigned_int,_4>::Vector(&local_a4,uVar3,uVar4,uVar7,0x780);
    *(undefined8 *)_v1_local->m_data = local_a4.m_data._0_8_;
    *(undefined8 *)(_v1_local->m_data + 2) = local_a4.m_data._8_8_;
    if (local_2c == 1) {
      puVar8 = Vector<unsigned_int,_4>::x(e1_local);
      puVar9 = Vector<unsigned_int,_4>::y(e1_local);
      std::swap<unsigned_int>(puVar8,puVar9);
      puVar8 = Vector<unsigned_int,_4>::x(_v1_local);
      puVar9 = Vector<unsigned_int,_4>::y(_v1_local);
      std::swap<unsigned_int>(puVar8,puVar9);
    }
    else if (local_2c == 2) {
      puVar8 = Vector<unsigned_int,_4>::x(e1_local);
      puVar9 = Vector<unsigned_int,_4>::z(e1_local);
      std::swap<unsigned_int>(puVar8,puVar9);
      puVar8 = Vector<unsigned_int,_4>::x(_v1_local);
      puVar9 = Vector<unsigned_int,_4>::z(_v1_local);
      std::swap<unsigned_int>(puVar8,puVar9);
    }
  }
  return;
}

Assistant:

void decodeHDREndpointMode11 (UVec4& e0, UVec4& e1, deUint32 v0, deUint32 v1, deUint32 v2, deUint32 v3, deUint32 v4, deUint32 v5)
{
	const deUint32 major = (getBit(v5, 7) << 1) | getBit(v4, 7);

	if (major == 3)
	{
		e0 = UVec4(v0<<4, v2<<4, getBits(v4,0,6)<<5, 0x780);
		e1 = UVec4(v1<<4, v3<<4, getBits(v5,0,6)<<5, 0x780);
	}
	else
	{
		const deUint32 mode = (getBit(v3, 7) << 2) | (getBit(v2, 7) << 1) | getBit(v1, 7);

		deInt32 a	= (deInt32)((getBit(v1, 6) << 8) | v0);
		deInt32 c	= (deInt32)(getBits(v1, 0, 5));
		deInt32 b0	= (deInt32)(getBits(v2, 0, 5));
		deInt32 b1	= (deInt32)(getBits(v3, 0, 5));
		deInt32 d0	= (deInt32)(getBits(v4, 0, 4));
		deInt32 d1	= (deInt32)(getBits(v5, 0, 4));

		{
#define SHOR(DST_VAR, SHIFT, BIT_VAR) (DST_VAR) |= (BIT_VAR) << (SHIFT)
#define ASSIGN_X_BITS(V0,S0, V1,S1, V2,S2, V3,S3, V4,S4, V5,S5) do { SHOR(V0,S0,x0); SHOR(V1,S1,x1); SHOR(V2,S2,x2); SHOR(V3,S3,x3); SHOR(V4,S4,x4); SHOR(V5,S5,x5); } while (false)

			const deUint32 x0 = getBit(v2, 6);
			const deUint32 x1 = getBit(v3, 6);
			const deUint32 x2 = getBit(v4, 6);
			const deUint32 x3 = getBit(v5, 6);
			const deUint32 x4 = getBit(v4, 5);
			const deUint32 x5 = getBit(v5, 5);

			switch (mode)
			{
				case 0: ASSIGN_X_BITS(b0,6,  b1,6,   d0,6,  d1,6,  d0,5,  d1,5); break;
				case 1: ASSIGN_X_BITS(b0,6,  b1,6,   b0,7,  b1,7,  d0,5,  d1,5); break;
				case 2: ASSIGN_X_BITS(a,9,   c,6,    d0,6,  d1,6,  d0,5,  d1,5); break;
				case 3: ASSIGN_X_BITS(b0,6,  b1,6,   a,9,   c,6,   d0,5,  d1,5); break;
				case 4: ASSIGN_X_BITS(b0,6,  b1,6,   b0,7,  b1,7,  a,9,   a,10); break;
				case 5: ASSIGN_X_BITS(a,9,   a,10,   c,7,   c,6,   d0,5,  d1,5); break;
				case 6: ASSIGN_X_BITS(b0,6,  b1,6,   a,11,  c,6,   a,9,   a,10); break;
				case 7: ASSIGN_X_BITS(a,9,   a,10,   a,11,  c,6,   d0,5,  d1,5); break;
				default:
					DE_ASSERT(false);
			}

#undef ASSIGN_X_BITS
#undef SHOR
		}

		static const int numDBits[] = { 7, 6, 7, 6, 5, 6, 5, 6 };
		DE_ASSERT(mode < DE_LENGTH_OF_ARRAY(numDBits));

		d0 = signExtend(d0, numDBits[mode]);
		d1 = signExtend(d1, numDBits[mode]);

		const int shiftAmount = (mode >> 1) ^ 3;
		a	<<= shiftAmount;
		c	<<= shiftAmount;
		b0	<<= shiftAmount;
		b1	<<= shiftAmount;
		d0	<<= shiftAmount;
		d1	<<= shiftAmount;

		e0 = UVec4(de::clamp(a-c,			0, 0xfff),
				   de::clamp(a-b0-c-d0,		0, 0xfff),
				   de::clamp(a-b1-c-d1,		0, 0xfff),
				   0x780);

		e1 = UVec4(de::clamp(a,				0, 0xfff),
				   de::clamp(a-b0,			0, 0xfff),
				   de::clamp(a-b1,			0, 0xfff),
				   0x780);

		if (major == 1)
		{
			std::swap(e0.x(), e0.y());
			std::swap(e1.x(), e1.y());
		}
		else if (major == 2)
		{
			std::swap(e0.x(), e0.z());
			std::swap(e1.x(), e1.z());
		}
	}
}